

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void __thiscall phosg::cannot_open_file::cannot_open_file(cannot_open_file *this,string *filename)

{
  uint *puVar1;
  int *piVar2;
  int error;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *filename_local;
  cannot_open_file *this_local;
  
  local_18 = filename;
  filename_local = (string *)this;
  ::std::operator+(&local_78,"can\'t open file ",filename);
  ::std::operator+(&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                   ": ");
  puVar1 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_a8,(phosg *)(ulong)*puVar1,error);
  ::std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a8);
  ::std::runtime_error::runtime_error((runtime_error *)&this->field_0x10,(string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::__cxx11::string::~string((string *)&local_78);
  this->_vptr_cannot_open_file = (_func_int **)0x15cac8;
  *(undefined8 *)&this->field_0x10 = 0x15caf8;
  piVar2 = __errno_location();
  this->error = *piVar2;
  return;
}

Assistant:

cannot_open_file::cannot_open_file(const string& filename)
    : runtime_error("can\'t open file " + filename + ": " + string_for_error(errno)),
      error(errno) {}